

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# discoverer.c
# Opt level: O0

void add_all_tests_from(FILE *nm_output_pipe,CgreenVector *tests,_Bool verbose)

{
  _Bool _Var1;
  int max_length;
  TestItem *pTVar2;
  byte in_DL;
  undefined8 in_RSI;
  TestItem *test_item;
  int length;
  char line [1000];
  undefined4 in_stack_fffffffffffffbf0;
  int in_stack_fffffffffffffbf4;
  char *in_stack_fffffffffffffbf8;
  FILE *in_stack_fffffffffffffc00;
  
  max_length = read_line(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
                         in_stack_fffffffffffffbf4);
  while( true ) {
    if (max_length < 0) {
      return;
    }
    _Var1 = complete_line_read((char *)CONCAT44(max_length,in_stack_fffffffffffffbf0));
    if (!_Var1) break;
    _Var1 = contains_cgreen_spec((char *)0x10454a);
    if ((_Var1) && (_Var1 = is_definition((char *)0x10455a), _Var1)) {
      strip_newline_from((char *)CONCAT44(max_length,in_stack_fffffffffffffbf0));
      cgreen_spec_start_of((char *)0x104574);
      pTVar2 = create_test_item_from((char *)CONCAT44(max_length,in_stack_fffffffffffffbf0));
      if ((in_DL & 1) != 0) {
        printf("Discovered %s:%s (%s)\n",pTVar2->context_name,pTVar2->test_name,
               pTVar2->specification_name);
      }
      cgreen_vector_add(in_RSI,pTVar2);
    }
    max_length = read_line(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,max_length);
  }
  panic("tools/discoverer.c",0x2b,"Too long line in nm output");
}

Assistant:

static void add_all_tests_from(FILE *nm_output_pipe, CgreenVector *tests, bool verbose) {
    char line[1000];
    int length = read_line(nm_output_pipe, line, sizeof(line)-1);
    while (length > -1) {       /* TODO: >0 ? */
        if (!complete_line_read(line))
            PANIC("Too long line in nm output");
        if (contains_cgreen_spec(line) && is_definition(line)) {
            strip_newline_from(line);
            TestItem *test_item = create_test_item_from(cgreen_spec_start_of(line));
            if (verbose)
                printf("Discovered %s:%s (%s)\n", test_item->context_name, test_item->test_name,
                       test_item->specification_name);
            cgreen_vector_add(tests, test_item);
        }
        length = read_line(nm_output_pipe, line, sizeof(line)-1);
    }
}